

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::PaddingLayerParams::_InternalSerialize
          (PaddingLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>
                       (1,(this->PaddingType_).constant_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingReflection>
                       (2,(this->PaddingType_).reflection_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingReplication>
                       (3,(this->PaddingType_).replication_,puVar1,stream);
  }
  if ((this != (PaddingLayerParams *)_PaddingLayerParams_default_instance_) &&
     (this->paddingamounts_ != (BorderAmounts *)0x0)) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::BorderAmounts>
                       (10,this->paddingamounts_,puVar1,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* PaddingLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.PaddingLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
  if (_internal_has_constant()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::constant(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
  if (_internal_has_reflection()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::reflection(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
  if (_internal_has_replication()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::replication(this), target, stream);
  }

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->_internal_has_paddingamounts()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::paddingamounts(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.PaddingLayerParams)
  return target;
}